

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
          (SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL> *this,Base *other)

{
  bool bVar1;
  move_iterator<slang::IntervalMapDetails::Path::Entry_*> last;
  move_iterator<slang::IntervalMapDetails::Path::Entry_*> this_00;
  Entry *pEVar2;
  unsigned_long uVar3;
  move_iterator<slang::IntervalMapDetails::Path::Entry_*> in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  Entry *in_stack_ffffffffffffff98;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_stack_ffffffffffffffa0;
  
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::SmallVectorBase(in_RDI);
  bVar1 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::isSmall
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)in_RSI._M_current);
  if (bVar1) {
    in_RDI->cap = 2;
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::begin
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)in_RSI._M_current);
    last = std::make_move_iterator<slang::IntervalMapDetails::Path::Entry*>
                     (in_stack_ffffffffffffff98);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::end
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)in_RSI._M_current);
    this_00 = std::make_move_iterator<slang::IntervalMapDetails::Path::Entry*>
                        (in_stack_ffffffffffffff98);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
    append<std::move_iterator<slang::IntervalMapDetails::Path::Entry_*>_>
              ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00._M_current,in_RSI,
               last);
    SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::clear(in_stack_ffffffffffffffa0);
  }
  else {
    pEVar2 = std::exchange<slang::IntervalMapDetails::Path::Entry*,decltype(nullptr)>
                       (&in_stack_ffffffffffffffa0->data_,&in_stack_ffffffffffffff98->node);
    in_RDI->data_ = pEVar2;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->len = uVar3;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->cap = uVar3;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }